

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

void __thiscall OpenMD::SelectionSet::clearAll(SelectionSet *this)

{
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RDI,(long)iVar1);
    OpenMDBitSet::clearAll((OpenMDBitSet *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void SelectionSet::clearAll() {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].clearAll();
  }